

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elempatch.c
# Opt level: O3

void nga_vfill_patch(Integer *g_a,Integer *lo,Integer *hi)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Integer IVar3;
  logical lVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  int iVar17;
  undefined1 auVar15 [16];
  int iVar18;
  undefined1 auVar16 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  void *data_ptr;
  Integer ndim;
  Integer hiA [7];
  Integer loA [7];
  Integer type;
  Integer baseld [7];
  Integer ld [7];
  Integer dims [7];
  long local_210;
  int local_204;
  Integer local_200;
  long local_1f8 [7];
  long alStack_1c0 [9];
  undefined1 local_178 [16];
  undefined1 local_168 [48];
  Integer *local_138;
  Integer local_130;
  long local_128 [8];
  long alStack_e8 [8];
  long local_a8 [8];
  Integer local_68 [7];
  
  local_138 = hi;
  IVar3 = pnga_nodeid();
  bVar14 = _ga_sync_begin != 0;
  local_204 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar14) {
    GA_Sync();
  }
  pnga_inquire(*g_a,&local_130,&local_200,local_68);
  pnga_distribution(*g_a,IVar3,alStack_1c0 + 1,local_1f8);
  lVar4 = pnga_patch_intersect(lo,local_138,alStack_1c0 + 1,local_1f8,local_200);
  if (lVar4 != 0) {
    pnga_access_ptr(*g_a,alStack_1c0 + 1,local_1f8,&local_210,local_a8);
    IVar3 = local_200;
    lVar10 = 1;
    if (1 < local_200) {
      lVar5 = 1;
      do {
        lVar10 = lVar10 * ((local_1f8[lVar5] - alStack_1c0[lVar5 + 1]) + 1);
        lVar5 = lVar5 + 1;
      } while (local_200 != lVar5);
    }
    local_178 = ZEXT816(0);
    alStack_e8[1] = 1;
    local_128[0] = local_a8[0];
    lVar5 = local_a8[0] * local_a8[1];
    local_128[1] = lVar5;
    if (2 < local_200) {
      memset(local_168,0,local_200 * 8 - 0x10);
      lVar6 = 2;
      lVar9 = 1;
      do {
        lVar9 = lVar9 * (((&local_200)[lVar6] - alStack_1c0[lVar6]) + 1);
        lVar5 = lVar5 * local_a8[lVar6];
        alStack_e8[lVar6] = lVar9;
        local_128[lVar6] = lVar5;
        lVar6 = lVar6 + 1;
      } while (IVar3 != lVar6);
    }
    auVar2 = _DAT_001b6030;
    auVar1 = _DAT_001b6020;
    auVar16 = _DAT_001b6010;
    switch(local_130) {
    case 0x3e9:
      if (0 < lVar10) {
        lVar5 = local_1f8[0] - alStack_1c0[1];
        auVar15._8_4_ = (int)lVar5;
        auVar15._0_8_ = lVar5;
        auVar15._12_4_ = (int)((ulong)lVar5 >> 0x20);
        lVar6 = 0;
        auVar15 = auVar15 ^ _DAT_001b6030;
        do {
          if (IVar3 < 2) {
            lVar9 = 0;
          }
          else {
            lVar11 = 0;
            lVar9 = 0;
            do {
              lVar9 = lVar9 + local_128[lVar11] * *(long *)(local_178 + lVar11 * 8 + 8);
              lVar13 = *(long *)(local_178 + lVar11 * 8 + 8) +
                       (ulong)((lVar6 + 1) % alStack_e8[lVar11 + 1] == 0);
              lVar12 = 0;
              if (lVar13 <= local_1f8[lVar11 + 1] - alStack_1c0[lVar11 + 2]) {
                lVar12 = lVar13;
              }
              *(long *)(local_178 + lVar11 * 8 + 8) = lVar12;
              lVar11 = lVar11 + 1;
            } while (IVar3 + -1 != lVar11);
          }
          uVar8 = lVar5 + 4U & 0xfffffffffffffffc;
          auVar24 = auVar1;
          auVar20 = auVar16;
          if (alStack_1c0[1] <= local_1f8[0]) {
            do {
              auVar23 = auVar24 ^ auVar2;
              iVar17 = auVar15._4_4_;
              iVar18 = (int)lVar9;
              if ((bool)(~(auVar23._4_4_ == iVar17 && auVar15._0_4_ < auVar23._0_4_ ||
                          iVar17 < auVar23._4_4_) & 1)) {
                *(int *)(local_210 + lVar9 * 4) = iVar18;
              }
              if ((auVar23._12_4_ != auVar15._12_4_ || auVar23._8_4_ <= auVar15._8_4_) &&
                  auVar23._12_4_ <= auVar15._12_4_) {
                *(int *)(local_210 + 4 + lVar9 * 4) = iVar18 + 1;
              }
              iVar25 = SUB164(auVar20 ^ auVar2,4);
              if (iVar25 <= iVar17 &&
                  (iVar25 != iVar17 || SUB164(auVar20 ^ auVar2,0) <= auVar15._0_4_)) {
                *(int *)(local_210 + 8 + lVar9 * 4) = iVar18 + 2;
                *(int *)(local_210 + 0xc + lVar9 * 4) = iVar18 + 3;
              }
              auVar19._0_8_ = auVar24._0_8_ + 4;
              auVar19._8_8_ = auVar24._8_8_ + 4;
              auVar21._0_8_ = auVar20._0_8_ + 4;
              auVar21._8_8_ = auVar20._8_8_ + 4;
              lVar9 = lVar9 + 4;
              uVar8 = uVar8 - 4;
              auVar24 = auVar19;
              auVar20 = auVar21;
            } while (uVar8 != 0);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != lVar10);
      }
      break;
    case 0x3ea:
      if (0 < lVar10) {
        lVar5 = 0;
        do {
          if (local_200 < 2) {
            lVar6 = 0;
          }
          else {
            lVar9 = 0;
            lVar6 = 0;
            do {
              lVar6 = lVar6 + local_128[lVar9] * *(long *)(local_178 + lVar9 * 8 + 8);
              lVar12 = *(long *)(local_178 + lVar9 * 8 + 8) +
                       (ulong)((lVar5 + 1) % alStack_e8[lVar9 + 1] == 0);
              lVar11 = 0;
              if (lVar12 <= local_1f8[lVar9 + 1] - alStack_1c0[lVar9 + 2]) {
                lVar11 = lVar12;
              }
              *(long *)(local_178 + lVar9 * 8 + 8) = lVar11;
              lVar9 = lVar9 + 1;
            } while (local_200 + -1 != lVar9);
          }
          if (alStack_1c0[1] <= local_1f8[0]) {
            lVar9 = 0;
            do {
              *(long *)(local_210 + lVar6 * 8 + lVar9 * 8) = lVar6 + lVar9;
              bVar14 = lVar9 < local_1f8[0] - alStack_1c0[1];
              lVar9 = lVar9 + 1;
            } while (bVar14);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != lVar10);
      }
      break;
    case 0x3eb:
      if (0 < lVar10) {
        lVar5 = local_1f8[0] - alStack_1c0[1];
        auVar20._8_4_ = (int)lVar5;
        auVar20._0_8_ = lVar5;
        auVar20._12_4_ = (int)((ulong)lVar5 >> 0x20);
        lVar6 = 0;
        auVar20 = auVar20 ^ _DAT_001b6030;
        do {
          if (IVar3 < 2) {
            lVar9 = 0;
          }
          else {
            lVar11 = 0;
            lVar9 = 0;
            do {
              lVar9 = lVar9 + local_128[lVar11] * *(long *)(local_178 + lVar11 * 8 + 8);
              lVar13 = *(long *)(local_178 + lVar11 * 8 + 8) +
                       (ulong)((lVar6 + 1) % alStack_e8[lVar11 + 1] == 0);
              lVar12 = 0;
              if (lVar13 <= local_1f8[lVar11 + 1] - alStack_1c0[lVar11 + 2]) {
                lVar12 = lVar13;
              }
              *(long *)(local_178 + lVar11 * 8 + 8) = lVar12;
              lVar11 = lVar11 + 1;
            } while (IVar3 + -1 != lVar11);
          }
          if (alStack_1c0[1] <= local_1f8[0]) {
            lVar9 = lVar9 + 3;
            uVar8 = lVar5 + 4U & 0xfffffffffffffffc;
            auVar23 = auVar1;
            auVar22 = auVar16;
            do {
              auVar24 = auVar23 ^ auVar2;
              iVar18 = auVar20._4_4_;
              if ((bool)(~(auVar24._4_4_ == iVar18 && auVar20._0_4_ < auVar24._0_4_ ||
                          iVar18 < auVar24._4_4_) & 1)) {
                *(float *)(local_210 + -0xc + lVar9 * 4) = (float)(lVar9 + -3);
              }
              if ((auVar24._12_4_ != auVar20._12_4_ || auVar24._8_4_ <= auVar20._8_4_) &&
                  auVar24._12_4_ <= auVar20._12_4_) {
                *(float *)(local_210 + -8 + lVar9 * 4) = (float)(lVar9 + -2);
              }
              iVar17 = SUB164(auVar22 ^ auVar2,4);
              if (iVar17 <= iVar18 &&
                  (iVar17 != iVar18 || SUB164(auVar22 ^ auVar2,0) <= auVar20._0_4_)) {
                *(float *)(local_210 + -4 + lVar9 * 4) = (float)(lVar9 + -1);
                *(float *)(local_210 + lVar9 * 4) = (float)lVar9;
              }
              lVar11 = auVar23._8_8_;
              auVar23._0_8_ = auVar23._0_8_ + 4;
              auVar23._8_8_ = lVar11 + 4;
              lVar11 = auVar22._8_8_;
              auVar22._0_8_ = auVar22._0_8_ + 4;
              auVar22._8_8_ = lVar11 + 4;
              lVar9 = lVar9 + 4;
              uVar8 = uVar8 - 4;
            } while (uVar8 != 0);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != lVar10);
      }
      break;
    case 0x3ec:
      if (0 < lVar10) {
        lVar5 = local_1f8[0] - alStack_1c0[1];
        auVar16._8_4_ = (int)lVar5;
        auVar16._0_8_ = lVar5;
        auVar16._12_4_ = (int)((ulong)lVar5 >> 0x20);
        lVar6 = 0;
        auVar16 = auVar16 ^ _DAT_001b6030;
        do {
          if (IVar3 < 2) {
            lVar9 = 0;
          }
          else {
            lVar11 = 0;
            lVar9 = 0;
            do {
              lVar9 = lVar9 + local_128[lVar11] * *(long *)(local_178 + lVar11 * 8 + 8);
              lVar13 = *(long *)(local_178 + lVar11 * 8 + 8) +
                       (ulong)((lVar6 + 1) % alStack_e8[lVar11 + 1] == 0);
              lVar12 = 0;
              if (lVar13 <= local_1f8[lVar11 + 1] - alStack_1c0[lVar11 + 2]) {
                lVar12 = lVar13;
              }
              *(long *)(local_178 + lVar11 * 8 + 8) = lVar12;
              lVar11 = lVar11 + 1;
            } while (IVar3 + -1 != lVar11);
          }
          if (alStack_1c0[1] <= local_1f8[0]) {
            lVar9 = lVar9 + 1;
            uVar8 = lVar5 + 2U & 0xfffffffffffffffe;
            auVar24 = auVar1;
            do {
              auVar20 = auVar24 ^ auVar2;
              if ((bool)(~(auVar16._4_4_ < auVar20._4_4_ ||
                          auVar16._0_4_ < auVar20._0_4_ && auVar20._4_4_ == auVar16._4_4_) & 1)) {
                *(double *)(local_210 + -8 + lVar9 * 8) = (double)(lVar9 + -1);
              }
              if (auVar20._12_4_ <= auVar16._12_4_ &&
                  (auVar20._8_4_ <= auVar16._8_4_ || auVar20._12_4_ != auVar16._12_4_)) {
                *(double *)(local_210 + lVar9 * 8) = (double)lVar9;
              }
              lVar11 = auVar24._8_8_;
              auVar24._0_8_ = auVar24._0_8_ + 2;
              auVar24._8_8_ = lVar11 + 2;
              lVar9 = lVar9 + 2;
              uVar8 = uVar8 - 2;
            } while (uVar8 != 0);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != lVar10);
      }
      break;
    default:
      GA_Error(" wrong data type ",(int)local_130);
      break;
    case 0x3ee:
      if (0 < lVar10) {
        lVar5 = 0;
        do {
          if (IVar3 < 2) {
            lVar6 = 0;
          }
          else {
            lVar9 = 0;
            lVar6 = 0;
            do {
              lVar6 = lVar6 + local_128[lVar9] * *(long *)(local_178 + lVar9 * 8 + 8);
              lVar12 = *(long *)(local_178 + lVar9 * 8 + 8) +
                       (ulong)((lVar5 + 1) % alStack_e8[lVar9 + 1] == 0);
              lVar11 = 0;
              if (lVar12 <= local_1f8[lVar9 + 1] - alStack_1c0[lVar9 + 2]) {
                lVar11 = lVar12;
              }
              *(long *)(local_178 + lVar9 * 8 + 8) = lVar11;
              lVar9 = lVar9 + 1;
            } while (IVar3 + -1 != lVar9);
          }
          lVar9 = (local_1f8[0] - alStack_1c0[1]) + 1;
          if (alStack_1c0[1] <= local_1f8[0]) {
            do {
              *(float *)(local_210 + lVar6 * 8) = (float)lVar6;
              *(float *)(local_210 + 4 + lVar6 * 8) = (float)lVar6;
              lVar6 = lVar6 + 1;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != lVar10);
      }
      break;
    case 0x3ef:
      if (0 < lVar10) {
        lVar5 = 0;
        do {
          if (IVar3 < 2) {
            lVar6 = 0;
          }
          else {
            lVar9 = 0;
            lVar6 = 0;
            do {
              lVar6 = lVar6 + local_128[lVar9] * *(long *)(local_178 + lVar9 * 8 + 8);
              lVar12 = *(long *)(local_178 + lVar9 * 8 + 8) +
                       (ulong)((lVar5 + 1) % alStack_e8[lVar9 + 1] == 0);
              lVar11 = 0;
              if (lVar12 <= local_1f8[lVar9 + 1] - alStack_1c0[lVar9 + 2]) {
                lVar11 = lVar12;
              }
              *(long *)(local_178 + lVar9 * 8 + 8) = lVar11;
              lVar9 = lVar9 + 1;
            } while (IVar3 + -1 != lVar9);
          }
          if (alStack_1c0[1] <= local_1f8[0]) {
            pdVar7 = (double *)(lVar6 * 0x10 + local_210 + 8);
            lVar9 = (local_1f8[0] - alStack_1c0[1]) + 1;
            do {
              pdVar7[-1] = (double)lVar6;
              *pdVar7 = (double)lVar6;
              pdVar7 = pdVar7 + 2;
              lVar6 = lVar6 + 1;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != lVar10);
      }
    }
    pnga_release_update(*g_a,alStack_1c0 + 1,local_1f8);
  }
  if (local_204 != 0) {
    GA_Sync();
  }
  return;
}

Assistant:

void nga_vfill_patch(Integer *g_a, Integer *lo, Integer *hi)
{
  Integer i, j;
  Integer ndim, dims[MAXDIM], type;
  Integer loA[MAXDIM], hiA[MAXDIM], ld[MAXDIM];
  void *data_ptr;
  Integer idx, n1dim;
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseld[MAXDIM];
  Integer me= pnga_nodeid();
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)GA_Sync(); 

  pnga_inquire(*g_a,  &type, &ndim, dims);

  /* get limits of VISIBLE patch */ 
  pnga_distribution(*g_a, me, loA, hiA);

  /*  determine subset of my local patch to access  */
  /*  Output is in loA and hiA */
  if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

    /* get data_ptr to corner of patch */
    /* ld are leading dimensions INCLUDING ghost cells */
    pnga_access_ptr(*g_a, loA, hiA, &data_ptr, ld);

    /* number of n-element of the first dimension */
    n1dim = 1; for(i=1; i<ndim; i++) n1dim *= (hiA[i] - loA[i] + 1);

    /* calculate the destination indices */
    bvalue[0] = 0; bvalue[1] = 0; bunit[0] = 1; bunit[1] = 1;
    /* baseld[0] = ld[0]
     * baseld[1] = ld[0] * ld[1]
     * baseld[2] = ld[0] * ld[1] * ld[2] .....
     */
    baseld[0] = ld[0]; baseld[1] = baseld[0] *ld[1];
    for(i=2; i<ndim; i++) {
      bvalue[i] = 0;
      bunit[i] = bunit[i-1] * (hiA[i-1] - loA[i-1] + 1);
      baseld[i] = baseld[i-1] * ld[i];
    }

    switch (type){
      case C_INT:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }
          for(j=0; j<(hiA[0]-loA[0]+1); j++)
            ((int *)data_ptr)[idx+j] = (int)(idx+j);
        }
        break;
      case C_DCPL:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }

          for(j=0; j<(hiA[0]-loA[0]+1); j++) {
            ((DoubleComplex *)data_ptr)[idx+j].real = (double)(idx+j);
            ((DoubleComplex *)data_ptr)[idx+j].imag = (double)(idx+j);
          }
        }

        break;
      case C_SCPL:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }

          for(j=0; j<(hiA[0]-loA[0]+1); j++) {
            ((SingleComplex *)data_ptr)[idx+j].real = (float)(idx+j);
            ((SingleComplex *)data_ptr)[idx+j].imag = (float)(idx+j);
          }
        }

        break;
      case C_DBL:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }

          for(j=0; j<(hiA[0]-loA[0]+1); j++) 
            ((double*)data_ptr)[idx+j] = (double)(idx+j);
        }
        break;
      case C_FLOAT:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }
          for(j=0; j<(hiA[0]-loA[0]+1); j++)
            ((float *)data_ptr)[idx+j] = (float)(idx+j);
        }
        break;     
      case C_LONG:
        for(i=0; i<n1dim; i++) {
          idx = 0;
          for(j=1; j<ndim; j++) {
            idx += bvalue[j] * baseld[j-1];
            if(((i+1) % bunit[j]) == 0) bvalue[j]++;
            if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
          }
          for(j=0; j<(hiA[0]-loA[0]+1); j++)
            ((long *)data_ptr)[idx+j] = (long)(idx+j);
        } 
        break;                          
      default: GA_Error(" wrong data type ",type);
    }

    /* release access to the data */
    pnga_release_update(*g_a, loA, hiA);
  }
  if(local_sync_end)GA_Sync();
}